

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O2

int __thiscall
tchecker::typed_while_statement_t::clone
          (typed_while_statement_t *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  typed_expression_t *ptVar1;
  typed_statement_t *ptVar2;
  typed_while_statement_t *this_00;
  shared_ptr<const_tchecker::typed_statement_t> stmt_clone;
  shared_ptr<const_tchecker::typed_expression_t> cond_clone;
  
  ptVar1 = condition(this);
  ptVar1 = (typed_expression_t *)(**(code **)(*(long *)ptVar1 + 0x28))(ptVar1);
  std::__shared_ptr<tchecker::typed_expression_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::typed_expression_t,void>
            ((__shared_ptr<tchecker::typed_expression_t_const,(__gnu_cxx::_Lock_policy)2> *)
             &cond_clone,ptVar1);
  ptVar2 = statement(this);
  ptVar2 = (typed_statement_t *)(**(code **)(*(long *)ptVar2 + 0x28))(ptVar2);
  std::__shared_ptr<tchecker::typed_statement_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::typed_statement_t,void>
            ((__shared_ptr<tchecker::typed_statement_t_const,(__gnu_cxx::_Lock_policy)2> *)
             &stmt_clone,ptVar2);
  this_00 = (typed_while_statement_t *)operator_new(0x38);
  typed_while_statement_t(this_00,(this->super_typed_statement_t)._type,&cond_clone,&stmt_clone);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&stmt_clone.
              super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cond_clone.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (int)this_00;
}

Assistant:

tchecker::typed_while_statement_t * typed_while_statement_t::clone() const
{
  std::shared_ptr<tchecker::typed_expression_t const> cond_clone{condition().clone()};
  std::shared_ptr<tchecker::typed_statement_t const> stmt_clone{statement().clone()};
  return new tchecker::typed_while_statement_t(_type, cond_clone, stmt_clone);
}